

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O0

void __thiscall
xLearn::DMatrix::AddNode
          (DMatrix *this,index_t row_id,index_t feat_id,real_t feat_val,index_t field_id)

{
  ostream *poVar1;
  ostream *poVar2;
  reference ppvVar3;
  value_type pvVar4;
  index_t in_ECX;
  index_t in_EDX;
  uint in_ESI;
  long in_RDI;
  real_t in_XMM0_Da;
  Node node;
  value_type *in_stack_fffffffffffffef8;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_ffffffffffffff00;
  string *function;
  string *in_stack_ffffffffffffff78;
  LogSeverity in_stack_ffffffffffffff84;
  string local_78 [55];
  undefined1 local_41 [37];
  Logger local_1c;
  index_t local_18;
  real_t local_14;
  index_t local_10;
  uint local_c;
  
  local_c = in_ESI;
  if (*(uint *)(in_RDI + 0x10) <= in_ESI) {
    Logger::Logger(&local_1c,ERR);
    function = (string *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_41 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
               ,(allocator *)function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"AddNode",(allocator *)&stack0xffffffffffffff87);
    poVar1 = Logger::Start(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                           (int)((ulong)in_RDI >> 0x20),function);
    poVar1 = std::operator<<(poVar1,"CHECK_GT failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xd0);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"row_length");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RDI + 0x10));
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"row_id");
    poVar1 = std::operator<<(poVar1," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar1,local_c);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
    std::__cxx11::string::~string((string *)(local_41 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_41);
    Logger::~Logger((Logger *)poVar1);
    abort();
  }
  local_18 = in_ECX;
  local_14 = in_XMM0_Da;
  local_10 = in_EDX;
  ppvVar3 = std::
            vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                          *)(in_RDI + 0x18),(ulong)in_ESI);
  if (*ppvVar3 == (value_type)0x0) {
    pvVar4 = (value_type)operator_new(0x18);
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::vector
              ((vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x169c1d);
    ppvVar3 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(in_RDI + 0x18),(ulong)local_c);
    *ppvVar3 = pvVar4;
  }
  Node::Node((Node *)&stack0xffffffffffffff78,local_18,local_10,local_14);
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                *)(in_RDI + 0x18),(ulong)local_c);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::push_back
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  return;
}

Assistant:

void AddNode(index_t row_id,  
               index_t feat_id,
               real_t feat_val, 
               index_t field_id = 0) {
    CHECK_GT(row_length, row_id);
    // Allocate memory for the first adding
    if (row[row_id] == nullptr) {
      row[row_id] = new SparseRow;
    }
    Node node(field_id, feat_id, feat_val);
    row[row_id]->push_back(node);
  }